

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O3

size_t __thiscall FIX::FieldMap::totalFields(FieldMap *this)

{
  _Base_ptr p_Var1;
  size_t sVar2;
  _Rb_tree_node_base *p_Var3;
  FieldMap **group;
  _Base_ptr p_Var4;
  size_t sVar5;
  
  sVar5 = ((long)(this->m_fields).
                 super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->m_fields).
                 super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
  for (p_Var3 = (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_groups)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    p_Var1 = p_Var3[1]._M_left;
    for (p_Var4 = p_Var3[1]._M_parent; p_Var4 != p_Var1; p_Var4 = (_Base_ptr)&p_Var4->_M_parent) {
      sVar2 = totalFields(*(FieldMap **)p_Var4);
      sVar5 = sVar5 + sVar2;
    }
  }
  return sVar5;
}

Assistant:

size_t FieldMap::totalFields() const {
  size_t result = m_fields.size();

  for (auto const &tagWithGroups : m_groups) {
    for (auto const &group : tagWithGroups.second) {
      result += group->totalFields();
    }
  }
  return result;
}